

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_metadata.cpp
# Opt level: O3

duckdb * __thiscall duckdb::ParquetLogicalTypeToString(duckdb *this,LogicalType *type,bool is_set)

{
  _LogicalType__isset _Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined3 in_register_00000011;
  int iVar3;
  undefined4 in_register_00000014;
  LogicalType *this_00;
  LogicalType local_200 [24];
  LogicalType local_1e8 [24];
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  iVar3 = CONCAT31(in_register_00000011,is_set);
  if (iVar3 == 0) {
    duckdb::LogicalType::LogicalType(local_1e8,SQLNULL);
    duckdb::Value::Value((Value *)this,local_1e8);
    this_00 = local_1e8;
LAB_0029b36d:
    duckdb::LogicalType::~LogicalType(this_00);
  }
  else {
    _Var1 = type->__isset;
    if (((ushort)_Var1 & 1) == 0) {
      if (((ushort)_Var1 & 2) == 0) {
        if (((ushort)_Var1 & 4) == 0) {
          if (((ushort)_Var1 & 8) == 0) {
            if (((ushort)_Var1 & 0x10) == 0) {
              if (((ushort)_Var1 & 0x20) == 0) {
                if (((ushort)_Var1 & 0x40) == 0) {
                  if (_Var1._0_1_ < '\0') {
                    PrintParquetElementToString<duckdb_parquet::TimestampType_const&>
                              (&local_110,(duckdb *)&type->TIMESTAMP,
                               (TimestampType *)CONCAT44(in_register_00000014,iVar3));
                    duckdb::Value::Value((Value *)this,&local_110);
                    paVar2 = &local_110.field_2;
                  }
                  else if (((ushort)_Var1 >> 8 & 1) == 0) {
                    if (((ushort)_Var1 >> 9 & 1) == 0) {
                      if (((ushort)_Var1 >> 10 & 1) == 0) {
                        if (((ushort)_Var1 >> 0xb & 1) == 0) {
                          if (((ushort)_Var1 >> 0xc & 1) == 0) {
                            if (((ushort)_Var1 >> 0xd & 1) == 0) {
                              duckdb::LogicalType::LogicalType(local_200,SQLNULL);
                              duckdb::Value::Value((Value *)this,local_200);
                              this_00 = local_200;
                              goto LAB_0029b36d;
                            }
                            PrintParquetElementToString<duckdb_parquet::Float16Type_const&>
                                      (&local_1d0,(duckdb *)&type->FLOAT16,
                                       (Float16Type *)CONCAT44(in_register_00000014,iVar3));
                            duckdb::Value::Value((Value *)this,&local_1d0);
                            paVar2 = &local_1d0.field_2;
                          }
                          else {
                            PrintParquetElementToString<duckdb_parquet::UUIDType_const&>
                                      (&local_1b0,(duckdb *)&type->UUID,
                                       (UUIDType *)CONCAT44(in_register_00000014,iVar3));
                            duckdb::Value::Value((Value *)this,&local_1b0);
                            paVar2 = &local_1b0.field_2;
                          }
                        }
                        else {
                          PrintParquetElementToString<duckdb_parquet::BsonType_const&>
                                    (&local_190,(duckdb *)&type->BSON,
                                     (BsonType *)CONCAT44(in_register_00000014,iVar3));
                          duckdb::Value::Value((Value *)this,&local_190);
                          paVar2 = &local_190.field_2;
                        }
                      }
                      else {
                        PrintParquetElementToString<duckdb_parquet::JsonType_const&>
                                  (&local_170,(duckdb *)&type->JSON,
                                   (JsonType *)CONCAT44(in_register_00000014,iVar3));
                        duckdb::Value::Value((Value *)this,&local_170);
                        paVar2 = &local_170.field_2;
                      }
                    }
                    else {
                      PrintParquetElementToString<duckdb_parquet::NullType_const&>
                                (&local_150,(duckdb *)&type->UNKNOWN,
                                 (NullType *)CONCAT44(in_register_00000014,iVar3));
                      duckdb::Value::Value((Value *)this,&local_150);
                      paVar2 = &local_150.field_2;
                    }
                  }
                  else {
                    PrintParquetElementToString<duckdb_parquet::IntType_const&>
                              (&local_130,(duckdb *)&type->INTEGER,
                               (IntType *)CONCAT44(in_register_00000014,iVar3));
                    duckdb::Value::Value((Value *)this,&local_130);
                    paVar2 = &local_130.field_2;
                  }
                }
                else {
                  PrintParquetElementToString<duckdb_parquet::TimeType_const&>
                            (&local_f0,(duckdb *)&type->TIME,
                             (TimeType *)CONCAT44(in_register_00000014,iVar3));
                  duckdb::Value::Value((Value *)this,&local_f0);
                  paVar2 = &local_f0.field_2;
                }
              }
              else {
                PrintParquetElementToString<duckdb_parquet::DateType_const&>
                          (&local_d0,(duckdb *)&type->DATE,
                           (DateType *)CONCAT44(in_register_00000014,iVar3));
                duckdb::Value::Value((Value *)this,&local_d0);
                paVar2 = &local_d0.field_2;
              }
            }
            else {
              PrintParquetElementToString<duckdb_parquet::DecimalType_const&>
                        (&local_b0,(duckdb *)&type->DECIMAL,
                         (DecimalType *)CONCAT44(in_register_00000014,iVar3));
              duckdb::Value::Value((Value *)this,&local_b0);
              paVar2 = &local_b0.field_2;
            }
          }
          else {
            PrintParquetElementToString<duckdb_parquet::EnumType_const&>
                      (&local_90,(duckdb *)&type->ENUM,
                       (EnumType *)CONCAT44(in_register_00000014,iVar3));
            duckdb::Value::Value((Value *)this,&local_90);
            paVar2 = &local_90.field_2;
          }
        }
        else {
          PrintParquetElementToString<duckdb_parquet::ListType_const&>
                    (&local_70,(duckdb *)&type->LIST,
                     (ListType *)CONCAT44(in_register_00000014,iVar3));
          duckdb::Value::Value((Value *)this,&local_70);
          paVar2 = &local_70.field_2;
        }
      }
      else {
        PrintParquetElementToString<duckdb_parquet::MapType_const&>
                  (&local_50,(duckdb *)&type->MAP,(MapType *)CONCAT44(in_register_00000014,iVar3));
        duckdb::Value::Value((Value *)this,&local_50);
        paVar2 = &local_50.field_2;
      }
    }
    else {
      PrintParquetElementToString<duckdb_parquet::StringType_const&>
                (&local_30,(duckdb *)&type->STRING,
                 (StringType *)CONCAT44(in_register_00000014,iVar3));
      duckdb::Value::Value((Value *)this,&local_30);
      paVar2 = &local_30.field_2;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined1 **)(paVar2->_M_local_buf + -0x10) != paVar2) {
      operator_delete(*(undefined1 **)(paVar2->_M_local_buf + -0x10));
    }
  }
  return this;
}

Assistant:

Value ParquetLogicalTypeToString(const duckdb_parquet::LogicalType &type, bool is_set) {
	if (!is_set) {
		return Value();
	}
	if (type.__isset.STRING) {
		return Value(PrintParquetElementToString(type.STRING));
	}
	if (type.__isset.MAP) {
		return Value(PrintParquetElementToString(type.MAP));
	}
	if (type.__isset.LIST) {
		return Value(PrintParquetElementToString(type.LIST));
	}
	if (type.__isset.ENUM) {
		return Value(PrintParquetElementToString(type.ENUM));
	}
	if (type.__isset.DECIMAL) {
		return Value(PrintParquetElementToString(type.DECIMAL));
	}
	if (type.__isset.DATE) {
		return Value(PrintParquetElementToString(type.DATE));
	}
	if (type.__isset.TIME) {
		return Value(PrintParquetElementToString(type.TIME));
	}
	if (type.__isset.TIMESTAMP) {
		return Value(PrintParquetElementToString(type.TIMESTAMP));
	}
	if (type.__isset.INTEGER) {
		return Value(PrintParquetElementToString(type.INTEGER));
	}
	if (type.__isset.UNKNOWN) {
		return Value(PrintParquetElementToString(type.UNKNOWN));
	}
	if (type.__isset.JSON) {
		return Value(PrintParquetElementToString(type.JSON));
	}
	if (type.__isset.BSON) {
		return Value(PrintParquetElementToString(type.BSON));
	}
	if (type.__isset.UUID) {
		return Value(PrintParquetElementToString(type.UUID));
	}
	if (type.__isset.FLOAT16) {
		return Value(PrintParquetElementToString(type.FLOAT16));
	}
	return Value();
}